

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Voxelizer.cpp
# Opt level: O1

shared_ptr<Voxelizer> __thiscall
Voxelizer::Create(Voxelizer *this,shared_ptr<Scene> *scene,
                 shared_ptr<myvk::CommandPool> *command_pool,uint32_t octree_level)

{
  PhysicalDevice *this_00;
  Voxelizer *this_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_02;
  element_type *peVar1;
  element_type *peVar2;
  element_type *command_pool_00;
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  element_type *peVar5;
  undefined4 extraout_var_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  shared_ptr<Voxelizer> sVar7;
  shared_ptr<Voxelizer> *ret;
  shared_ptr<myvk::Device> device;
  shared_ptr<myvk::Device> local_88;
  string local_78;
  element_type *local_58;
  element_type *peStack_50;
  element_type *local_40;
  VkExtent2D local_38;
  
  iVar4 = (*(((command_pool->super___shared_ptr<myvk::CommandPool,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr)->super_DeviceObjectBase).super_Base._vptr_Base[2])();
  this_00 = *(PhysicalDevice **)(*(long *)CONCAT44(extraout_var,iVar4) + 0x18);
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_78,"VK_EXT_conservative_rasterization","");
  local_40 = (element_type *)command_pool;
  bVar3 = myvk::PhysicalDevice::GetExtensionSupport(this_00,&local_78,(uint32_t *)0x0);
  *(undefined8 *)this = 0;
  peVar5 = (element_type *)operator_new(0xe8);
  (peVar5->m_sampler).super___shared_ptr<myvk::Sampler,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x100000001;
  (peVar5->m_sampler).super___shared_ptr<myvk::Sampler,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&PTR___Sp_counted_ptr_inplace_0032c9c8;
  *(bool *)&(peVar5->m_textures).super__Vector_base<Scene::Texture,_std::allocator<Scene::Texture>_>
            ._M_impl.super__Vector_impl_data._M_start = bVar3;
  memset(&(peVar5->m_textures).super__Vector_base<Scene::Texture,_std::allocator<Scene::Texture>_>.
          _M_impl.super__Vector_impl_data._M_finish,0,0xc0);
  (this->m_scene_ptr).super___shared_ptr<Scene,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar5;
  *(vector<Scene::Texture,_std::allocator<Scene::Texture>_> **)this = &peVar5->m_textures;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  *(uint32_t *)
   &peVar5[1].m_descriptor_pool.super___shared_ptr<myvk::DescriptorPool,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = octree_level;
  *(int *)((long)&peVar5[1].m_descriptor_pool.
                  super___shared_ptr<myvk::DescriptorPool,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 4) =
       1 << ((byte)octree_level & 0x1f);
  (peVar5->m_textures).super__Vector_base<Scene::Texture,_std::allocator<Scene::Texture>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)(scene->super___shared_ptr<Scene,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &(peVar5->m_textures).
              super__Vector_base<Scene::Texture,_std::allocator<Scene::Texture>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             &(scene->super___shared_ptr<Scene,_(__gnu_cxx::_Lock_policy)2>)._M_refcount);
  command_pool_00 = local_40;
  iVar4 = (*(((element_type *)(local_40->super_DeviceObjectBase).super_Base._vptr_Base)->
            super_DeviceObjectBase).super_Base._vptr_Base[2])();
  local_88.super___shared_ptr<myvk::Device,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       *(element_type **)CONCAT44(extraout_var_00,iVar4);
  local_88.super___shared_ptr<myvk::Device,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       ((undefined8 *)CONCAT44(extraout_var_00,iVar4))[1];
  if (local_88.super___shared_ptr<myvk::Device,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_88.super___shared_ptr<myvk::Device,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_88.super___shared_ptr<myvk::Device,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_88.super___shared_ptr<myvk::Device,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_88.super___shared_ptr<myvk::Device,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  this_01 = *(Voxelizer **)this;
  Counter::Initialize(&this_01->m_atomic_counter,&local_88);
  create_descriptors(this_01,&local_88);
  create_render_pass(this_01,&local_88);
  create_pipeline(this_01,&local_88);
  local_78._M_dataplus._M_p = (pointer)0x0;
  local_78._M_string_length = 0;
  local_78.field_2._M_allocated_capacity = 0;
  local_38.width = this_01->m_voxel_resolution;
  local_38.height = local_38.width;
  myvk::Framebuffer::Create
            ((Framebuffer *)&local_58,&this_01->m_render_pass,
             (vector<std::shared_ptr<myvk::ImageView>,_std::allocator<std::shared_ptr<myvk::ImageView>_>_>
              *)&local_78,&local_38,1);
  peVar2 = peStack_50;
  peVar1 = local_58;
  local_58 = (element_type *)0x0;
  peStack_50 = (element_type *)0x0;
  this_02 = (this_01->m_framebuffer).
            super___shared_ptr<myvk::Framebuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (this_01->m_framebuffer).super___shared_ptr<myvk::Framebuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = peVar1;
  (this_01->m_framebuffer).super___shared_ptr<myvk::Framebuffer,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar2;
  if (this_02 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_02);
  }
  if (peStack_50 != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peStack_50);
  }
  std::vector<std::shared_ptr<myvk::ImageView>,_std::allocator<std::shared_ptr<myvk::ImageView>_>_>
  ::~vector((vector<std::shared_ptr<myvk::ImageView>,_std::allocator<std::shared_ptr<myvk::ImageView>_>_>
             *)&local_78);
  count_and_create_fragment_list(this_01,(shared_ptr<myvk::CommandPool> *)command_pool_00);
  _Var6._M_pi = extraout_RDX;
  if (local_88.super___shared_ptr<myvk::Device,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_88.super___shared_ptr<myvk::Device,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
    _Var6._M_pi = extraout_RDX_00;
  }
  sVar7.super___shared_ptr<Voxelizer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var6._M_pi;
  sVar7.super___shared_ptr<Voxelizer,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (shared_ptr<Voxelizer>)sVar7.super___shared_ptr<Voxelizer,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Voxelizer> Voxelizer::Create(const std::shared_ptr<Scene> &scene,
                                             const std::shared_ptr<myvk::CommandPool> &command_pool,
                                             uint32_t octree_level) {
	std::shared_ptr<Voxelizer> ret =
	    std::make_shared<Voxelizer>(command_pool->GetDevicePtr()->GetPhysicalDevicePtr()->GetExtensionSupport(
	        VK_EXT_CONSERVATIVE_RASTERIZATION_EXTENSION_NAME));

	ret->m_level = octree_level;
	ret->m_voxel_resolution = 1u << octree_level;
	ret->m_scene_ptr = scene;

	std::shared_ptr<myvk::Device> device = command_pool->GetDevicePtr();
	ret->m_atomic_counter.Initialize(device);
	ret->create_descriptors(device);
	ret->create_render_pass(device);
	ret->create_pipeline(device);
	ret->m_framebuffer =
	    myvk::Framebuffer::Create(ret->m_render_pass, {}, {ret->m_voxel_resolution, ret->m_voxel_resolution});
	ret->count_and_create_fragment_list(command_pool);

	return ret;
}